

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::CacheState::barrier
          (CacheState *this,VkPipelineStageFlags srcStages,VkAccessFlags srcAccesses,
          VkPipelineStageFlags dstStages,VkAccessFlags dstAccesses)

{
  VkAccessFlags (*__src) [15];
  uint *puVar1;
  VkPipelineStageFlagBits VVar2;
  bool bVar3;
  bool bVar4;
  PipelineStage PVar5;
  PipelineStage PVar6;
  VkPipelineStageFlagBits VVar7;
  ulong uVar8;
  VkPipelineStageFlags dstStage_;
  VkPipelineStageFlagBits VVar9;
  VkPipelineStageFlagBits flags;
  bool oldUnavailableLayoutTransition [15];
  VkPipelineStageFlags oldIncompleteOperations [15];
  VkAccessFlags oldUnavailableWriteOperations [15] [15];
  undefined7 local_408;
  undefined1 uStack_401;
  undefined7 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined8 uStack_3c4;
  uint local_3b8 [226];
  
  local_3f8 = *(undefined8 *)this->m_incompleteOperations;
  uStack_3f0 = *(undefined8 *)(this->m_incompleteOperations + 2);
  local_3e8 = *(undefined8 *)(this->m_incompleteOperations + 4);
  uStack_3e0 = *(undefined8 *)(this->m_incompleteOperations + 6);
  local_3d8 = *(undefined8 *)(this->m_incompleteOperations + 8);
  uStack_3c4 = *(undefined8 *)(this->m_incompleteOperations + 0xd);
  uStack_3d0 = (undefined4)*(undefined8 *)(this->m_incompleteOperations + 10);
  uStack_3cc = (undefined4)*(undefined8 *)(this->m_incompleteOperations + 0xb);
  uStack_3c8 = (undefined4)((ulong)*(undefined8 *)(this->m_incompleteOperations + 0xb) >> 0x20);
  __src = this->m_unavailableWriteOperations;
  memcpy(local_3b8,__src,900);
  local_408 = (undefined7)*(undefined8 *)this->m_unavailableLayoutTransition;
  uStack_401 = (undefined1)*(undefined8 *)(this->m_unavailableLayoutTransition + 7);
  uStack_400 = (undefined7)((ulong)*(undefined8 *)(this->m_unavailableLayoutTransition + 7) >> 8);
  if (srcStages != 0) {
    VVar2 = this->m_allowedStages;
    VVar7 = VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT;
    do {
      if ((VVar7 & srcStages) != 0 && dstStages != 0) {
        PVar5 = pipelineStageFlagToPipelineStage(VVar7);
        uVar8 = (ulong)PVar5;
        VVar9 = VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT;
        do {
          if ((VVar9 & dstStages) != 0) {
            PVar5 = pipelineStageFlagToPipelineStage(VVar9);
            this->m_incompleteOperations[PVar5] =
                 this->m_incompleteOperations[PVar5] & *(uint *)((long)&local_3f8 + uVar8 * 4);
            this->m_unavailableLayoutTransition[PVar5] =
                 (bool)(this->m_unavailableLayoutTransition[PVar5] &
                       *(byte *)((long)&local_408 + uVar8));
            if (VVar2 != 0) {
              flags = VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT;
              do {
                if ((VVar2 & flags) != 0) {
                  PVar6 = pipelineStageFlagToPipelineStage(flags);
                  puVar1 = (uint *)((long)__src[PVar5] + (ulong)(PVar6 << 2));
                  *puVar1 = *puVar1 & *(uint *)((long)local_3b8 + (ulong)(PVar6 << 2) + uVar8 * 0x3c
                                               );
                }
                flags = flags * 2;
              } while (flags <= VVar2);
            }
          }
          VVar9 = VVar9 * 2;
        } while (VVar9 <= dstStages);
      }
      VVar7 = VVar7 * 2;
    } while (VVar7 <= srcStages);
  }
  if (dstStages != 0) {
    VVar2 = this->m_allowedStages;
    VVar7 = VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT;
    do {
      if ((VVar7 & dstStages) != 0) {
        PVar5 = pipelineStageFlagToPipelineStage(VVar7);
        this->m_incompleteOperations[PVar5] = this->m_incompleteOperations[PVar5] & ~srcStages;
        if (VVar2 != 0) {
          bVar4 = true;
          bVar3 = true;
          VVar9 = VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT;
          do {
            PVar6 = pipelineStageFlagToPipelineStage(VVar9);
            if ((VVar2 & VVar9) != 0) {
              if ((srcStages & VVar9) != 0) {
                __src[PVar5][PVar6] = __src[PVar5][PVar6] & ~srcAccesses;
              }
              bVar3 = bVar4;
              if (__src[PVar5][PVar6] != 0) {
                bVar4 = false;
                bVar3 = false;
              }
            }
            VVar9 = VVar9 * 2;
          } while (VVar9 <= VVar2);
          if (!bVar3) goto LAB_00662c7a;
        }
        this->m_invisibleOperations[PVar5] = this->m_invisibleOperations[PVar5] & ~dstAccesses;
      }
LAB_00662c7a:
      VVar7 = VVar7 * 2;
    } while (VVar7 <= dstStages);
  }
  return;
}

Assistant:

void CacheState::barrier (vk::VkPipelineStageFlags	srcStages,
						  vk::VkAccessFlags			srcAccesses,
						  vk::VkPipelineStageFlags	dstStages,
						  vk::VkAccessFlags			dstAccesses)
{
	DE_ASSERT((srcStages & (~m_allowedStages)) == 0);
	DE_ASSERT((srcAccesses & (~m_allowedAccesses)) == 0);
	DE_ASSERT((dstStages & (~m_allowedStages)) == 0);
	DE_ASSERT((dstAccesses & (~m_allowedAccesses)) == 0);

	// Transitivity
	{
		vk::VkPipelineStageFlags		oldIncompleteOperations[PIPELINESTAGE_LAST];
		vk::VkAccessFlags				oldUnavailableWriteOperations[PIPELINESTAGE_LAST][PIPELINESTAGE_LAST];
		bool							oldUnavailableLayoutTransition[PIPELINESTAGE_LAST];

		deMemcpy(oldIncompleteOperations, m_incompleteOperations, sizeof(oldIncompleteOperations));
		deMemcpy(oldUnavailableWriteOperations, m_unavailableWriteOperations, sizeof(oldUnavailableWriteOperations));
		deMemcpy(oldUnavailableLayoutTransition, m_unavailableLayoutTransition, sizeof(oldUnavailableLayoutTransition));

		for (vk::VkPipelineStageFlags srcStage_ = 1; srcStage_ <= srcStages; srcStage_ <<= 1)
		{
			const PipelineStage srcStage = pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)srcStage_);

			if ((srcStage_ & srcStages) == 0)
				continue;

			for (vk::VkPipelineStageFlags dstStage_ = 1; dstStage_ <= dstStages; dstStage_ <<= 1)
			{
				const PipelineStage	dstStage			= pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)dstStage_);

				if ((dstStage_ & dstStages) == 0)
					continue;

				// Stages that have completed before srcStage have also completed before dstStage
				m_incompleteOperations[dstStage] &= oldIncompleteOperations[srcStage];

				// Image layout transition in srcStage are now available in dstStage
				m_unavailableLayoutTransition[dstStage] &= oldUnavailableLayoutTransition[srcStage];

				for (vk::VkPipelineStageFlags sharedStage_ = 1; sharedStage_ <= m_allowedStages; sharedStage_ <<= 1)
				{
					const PipelineStage	sharedStage			= pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)sharedStage_);

					if ((sharedStage_ & m_allowedStages) == 0)
						continue;

					// Writes that are available in srcStage are also available in dstStage
					m_unavailableWriteOperations[dstStage][sharedStage] &= oldUnavailableWriteOperations[srcStage][sharedStage];
				}
			}
		}
	}

	// Barrier
	for (vk::VkPipelineStageFlags dstStage_ = 1; dstStage_ <= dstStages; dstStage_ <<= 1)
	{
		const PipelineStage	dstStage			= pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)dstStage_);
		bool				allWritesAvailable	= true;

		if ((dstStage_ & dstStages) == 0)
			continue;

		// Operations in srcStages have completed before any stage in dstStages
		m_incompleteOperations[dstStage] &= ~srcStages;

		for (vk::VkPipelineStageFlags srcStage_ = 1; srcStage_ <= m_allowedStages; srcStage_ <<= 1)
		{
			const PipelineStage srcStage = pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)srcStage_);

			if ((srcStage_ & m_allowedStages) == 0)
				continue;

			// Make srcAccesses from srcStage available in dstStage
			if ((srcStage_ & srcStages) != 0)
				m_unavailableWriteOperations[dstStage][srcStage] &= ~srcAccesses;

			if (m_unavailableWriteOperations[dstStage][srcStage] != 0)
				allWritesAvailable = false;
		}

		// If all writes are available in dstStage make dstAccesses also visible
		if (allWritesAvailable)
			m_invisibleOperations[dstStage] &= ~dstAccesses;
	}
}